

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

type __thiscall
dg::pta::PointerGraph::nodeFactory<(dg::pta::PSNodeType)12,dg::pta::PSNode*&,dg::pta::PSNodeRet>
          (PointerGraph *this,PSNode **args)

{
  int iVar1;
  PSNodeRet *this_00;
  
  this_00 = (PSNodeRet *)operator_new(0x100);
  iVar1 = *(int *)(this + 0x40);
  *(IDType *)(this + 0x40) = iVar1 + 1U;
  PSNodeRet::PSNodeRet<dg::pta::PSNode*&>(this_00,iVar1 + 1U,args);
  return this_00;
}

Assistant:

typename std::enable_if<!std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        return new Node(getNewNodeId(), std::forward<Args>(args)...);
    }